

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleDateFormat::parseInt
          (SimpleDateFormat *this,UnicodeString *text,Formattable *number,int32_t maxDigits,
          ParsePosition *pos,UBool allowNegative,NumberFormat *fmt)

{
  int iVar1;
  Formattable *this_00;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  NumberFormat *pNVar6;
  int l;
  UnicodeString oldPrefix;
  ConstChar16Ptr local_d0;
  Formattable *local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_c8 = number;
  if (fmt == (NumberFormat *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(fmt,&NumberFormat::typeinfo,&DecimalFormat::typeinfo,0);
  }
  if (plVar4 == (long *)0x0 || allowNegative != '\0') {
    pNVar6 = (NumberFormat *)0x0;
  }
  else {
    lVar5 = (**(code **)(*plVar4 + 0x20))(plVar4);
    if (lVar5 == 0) {
      pNVar6 = (NumberFormat *)0x0;
    }
    else {
      pNVar6 = (NumberFormat *)__dynamic_cast(lVar5,&Format::typeinfo,&DecimalFormat::typeinfo,0);
    }
    if (pNVar6 == (NumberFormat *)0x0) goto LAB_002ca4aa;
    local_d0.p_ = L"꬀";
    icu_63::UnicodeString::UnicodeString(&local_b0,'\x01',&local_d0,-1);
    (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x2e])(pNVar6,&local_b0);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
    local_c0 = local_d0.p_;
    fmt = pNVar6;
  }
  this_00 = local_c8;
  iVar1 = pos->index;
  (*(fmt->super_Format).super_UObject._vptr_UObject[0x14])(fmt,text,local_c8,pos);
  if (0 < maxDigits) {
    iVar2 = pos->index - iVar1;
    iVar3 = iVar2 - maxDigits;
    if (iVar3 != 0 && maxDigits <= iVar2) {
      l = *(int *)&this_00->fValue;
      if (iVar3 != 0 && maxDigits <= iVar2) {
        iVar3 = iVar3 + 1;
        do {
          l = l / 10;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      pos->index = iVar1 + maxDigits;
      Formattable::setLong(this_00,l);
    }
  }
LAB_002ca4aa:
  if (pNVar6 != (NumberFormat *)0x0) {
    (*(pNVar6->super_Format).super_UObject._vptr_UObject[1])(pNVar6);
  }
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void SimpleDateFormat::parseInt(const UnicodeString& text,
                                Formattable& number,
                                int32_t maxDigits,
                                ParsePosition& pos,
                                UBool allowNegative,
                                const NumberFormat *fmt) const {
    UnicodeString oldPrefix;
    auto* fmtAsDF = dynamic_cast<const DecimalFormat*>(fmt);
    LocalPointer<DecimalFormat> df;
    if (!allowNegative && fmtAsDF != nullptr) {
        df.adoptInstead(dynamic_cast<DecimalFormat*>(fmtAsDF->clone()));
        if (df.isNull()) {
            // Memory allocation error
            return;
        }
        df->setNegativePrefix(UnicodeString(TRUE, SUPPRESS_NEGATIVE_PREFIX, -1));
        fmt = df.getAlias();
    }
    int32_t oldPos = pos.getIndex();
    fmt->parse(text, number, pos);

    if (maxDigits > 0) {
        // adjust the result to fit into
        // the maxDigits and move the position back
        int32_t nDigits = pos.getIndex() - oldPos;
        if (nDigits > maxDigits) {
            int32_t val = number.getLong();
            nDigits -= maxDigits;
            while (nDigits > 0) {
                val /= 10;
                nDigits--;
            }
            pos.setIndex(oldPos + maxDigits);
            number.setLong(val);
        }
    }
}